

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O0

void __thiscall TPZGeoMesh::RestoreReference(TPZGeoMesh *this,TPZCompMesh *cmesh)

{
  TPZAdmChunkVector<TPZCompEl_*,_10> *this_00;
  int64_t iVar1;
  TPZCompEl **ppTVar2;
  TPZCompMesh *in_RSI;
  long in_RDI;
  int64_t nelem;
  int64_t i;
  TPZCompEl *cel;
  TPZGeoEl *gel;
  TPZCompEl *this_01;
  TPZGeoMesh *in_stack_ffffffffffffffe0;
  TPZCompEl *elp;
  TPZGeoEl *in_stack_ffffffffffffffe8;
  
  ResetReference(in_stack_ffffffffffffffe0);
  *(TPZCompMesh **)(in_RDI + 0x28) = in_RSI;
  this_00 = TPZCompMesh::ElementVec(in_RSI);
  iVar1 = TPZChunkVector<TPZCompEl_*,_10>::NElements
                    (&this_00->super_TPZChunkVector<TPZCompEl_*,_10>);
  this_01 = (TPZCompEl *)0x0;
  do {
    if (iVar1 <= (long)this_01) {
      return;
    }
    TPZCompMesh::ElementVec(in_RSI);
    ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZCompEl_*,_10> *)in_RSI,
                         (int64_t)in_stack_ffffffffffffffe8);
    elp = *ppTVar2;
    if (elp != (TPZCompEl *)0x0) {
      in_stack_ffffffffffffffe8 = TPZCompEl::Reference(this_01);
      if (in_stack_ffffffffffffffe8 == (TPZGeoEl *)0x0) {
        std::operator<<((ostream *)&std::cerr,
                        "RestoreReference incomplete. Exist computational element with geometrical\n"
                       );
        std::operator<<((ostream *)&std::cerr,
                        "element not belongs to the current geometrical mesh.\n");
        return;
      }
      TPZGeoEl::SetReference(in_stack_ffffffffffffffe8,elp);
    }
    this_01 = (TPZCompEl *)&this_01->field_0x1;
  } while( true );
}

Assistant:

void TPZGeoMesh::RestoreReference(TPZCompMesh *cmesh)
{
	ResetReference();
	fReference = cmesh;
	TPZGeoEl *gel;
	TPZCompEl *cel;
	int64_t i,nelem = cmesh->ElementVec().NElements();
	for(i=0;i<nelem;i++)
	{
		cel = cmesh->ElementVec()[i];
		if(cel)
		{
			gel = cel->Reference();
			if(!gel)
			{
				PZError << "RestoreReference incomplete. Exist computational element with geometrical\n";
				PZError << "element not belongs to the current geometrical mesh.\n";
				return;
			}
			gel->SetReference(cel);
		}
	}
}